

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

void __thiscall Console::Prompt::Private::promptRemoveNext(Private *this)

{
  usize *puVar1;
  ulong size;
  uint *puVar2;
  Data *pDVar3;
  usize uVar4;
  ulong uVar5;
  Array<unsigned_int> newInput;
  String local_38;
  
  size = this->caretPos;
  puVar2 = (this->input)._begin.item;
  uVar5 = (long)(this->input)._end.item - (long)puVar2 >> 2;
  if (size < uVar5) {
    local_38._data.len = uVar5 - 1;
    if (size == local_38._data.len) {
      local_38.data = (Data *)((ulong)local_38.data & 0xffffffff00000000);
      Array<unsigned_int>::resize(&this->input,size,(uint *)&local_38);
    }
    else {
      local_38.data = (Data *)0x0;
      local_38._data.str = (char *)0x0;
      Array<unsigned_int>::append((Array<unsigned_int> *)&local_38,puVar2,size);
      puVar2 = (this->input)._begin.item;
      Array<unsigned_int>::append
                ((Array<unsigned_int> *)&local_38,puVar2 + this->caretPos + 1,
                 ~this->caretPos + ((long)(this->input)._end.item - (long)puVar2 >> 2));
      pDVar3 = (Data *)(this->input)._begin.item;
      puVar2 = (this->input)._end.item;
      uVar4 = (this->input)._capacity;
      (this->input)._begin.item = (uint *)local_38.data;
      (this->input)._end.item = (uint *)local_38._data.str;
      (this->input)._capacity = local_38._data.len;
      if (pDVar3 != (Data *)0x0) {
        local_38.data = pDVar3;
        local_38._data.str = (char *)puVar2;
        local_38._data.len = uVar4;
        operator_delete__(pDVar3);
      }
    }
    local_38.data = &local_38._data;
    local_38._data.ref = 0;
    local_38._data.str = " ";
    local_38._data.len = 1;
    promptWrite(this,((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2) +
                     this->caretPos,&local_38);
    if ((local_38.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_38.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_38.data != (Data *)0x0)) {
        operator_delete__(local_38.data);
      }
    }
  }
  return;
}

Assistant:

void promptRemoveNext()
  {
    if(caretPos < input.size())
    {
      if(caretPos != input.size() - 1)
      {
        Array<conchar> newInput(input.size() - 1);
        newInput.append(input,  caretPos);
        newInput.append((conchar*)input + caretPos + 1, input.size() - (caretPos + 1));
        input.swap(newInput);
      }
      else
        input.resize(caretPos);
      promptWrite(prompt.size() + caretPos, " ");
    }
  }